

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::TextureCubeView::gather
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,int componentNdx)

{
  float fVar1;
  int size_00;
  float *pfVar2;
  int in_ECX;
  undefined4 in_register_00000014;
  WrapMode *pWVar3;
  ulong extraout_XMM0_Qa;
  ulong uVar4;
  ulong uVar5;
  Vec4 VVar6;
  CubeFaceFloatCoords CVar7;
  Vector<float,_4> *local_200;
  ConstPixelBufferAccess *local_1c8;
  int local_1bc;
  int i_1;
  int sampleIndices [4];
  Vec4 sampleColors [4];
  float local_160;
  float v;
  float u;
  int size;
  float local_150;
  Vector<float,_3> local_144;
  undefined8 local_138;
  CubeFaceFloatCoords coords;
  int i;
  ConstPixelBufferAccess faceAccesses [6];
  int componentNdx_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  TextureCubeView *this_local;
  Vec4 *result;
  
  pWVar3 = (WrapMode *)CONCAT44(in_register_00000014,componentNdx);
  local_1c8 = (ConstPixelBufferAccess *)&coords.t;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess(local_1c8);
    local_1c8 = local_1c8 + 1;
  } while (local_1c8 != (ConstPixelBufferAccess *)&faceAccesses[5].m_data);
  for (coords.s = 0.0; (int)coords.s < 6; coords.s = (float)((int)coords.s + 1)) {
    memcpy((void *)((long)&coords + (long)(int)coords.s * 0x28 + 8),
           *(void **)(&sampler->wrapR + (long)(int)coords.s * 2),0x28);
  }
  Vector<float,_3>::Vector(&local_144,s,t,r);
  CVar7 = getCubeFaceCoords(&local_144);
  _u = CVar7._0_8_;
  local_138 = _u;
  local_150 = CVar7.t;
  coords.face = (CubeFace)local_150;
  size_00 = ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&coords.t);
  local_160 = local_138._4_4_;
  sampleColors[3].m_data[3] = (float)coords.face;
  if ((pWVar3[6] & CLAMP_TO_BORDER) != CLAMP_TO_EDGE) {
    local_160 = unnormalize(*pWVar3,local_138._4_4_,size_00);
    sampleColors[3].m_data[3] = unnormalize(pWVar3[1],(float)coords.face,size_00);
  }
  local_200 = (Vector<float,_4> *)(sampleIndices + 2);
  do {
    Vector<float,_4>::Vector(local_200);
    local_200 = local_200 + 1;
  } while (local_200 != (Vector<float,_4> *)(sampleColors[3].m_data + 2));
  uVar5 = (ulong)(uint)sampleColors[3].m_data[3];
  getCubeLinearSamples
            ((ConstPixelBufferAccess (*) [6])&coords.t,(CubeFace)local_138,local_160,
             sampleColors[3].m_data[3],0,(Vec4 (*) [4])(sampleIndices + 2));
  sampleIndices[0] = 1;
  sampleIndices[1] = 0;
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  uVar4 = extraout_XMM0_Qa;
  for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
    pfVar2 = Vector<float,_4>::operator[]
                       ((Vector<float,_4> *)
                        (sampleColors[(long)(int)sampleColors[0].m_data[(long)local_1bc + -6] + -1].
                         m_data + 2),in_ECX);
    fVar1 = *pfVar2;
    pfVar2 = Vector<float,_4>::operator[]((Vector<float,_4> *)this,local_1bc);
    uVar4 = (ulong)(uint)fVar1;
    *pfVar2 = fVar1;
  }
  VVar6.m_data[2] = (float)(int)uVar5;
  VVar6.m_data[3] = (float)(int)(uVar5 >> 0x20);
  VVar6.m_data[0] = (float)(int)uVar4;
  VVar6.m_data[1] = (float)(int)(uVar4 >> 0x20);
  return (Vec4)VVar6.m_data;
}

Assistant:

Vec4 TextureCubeView::gather (const Sampler& sampler, float s, float t, float r, int componentNdx) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
	for (int i = 0; i < (int)CUBEFACE_LAST; i++)
		faceAccesses[i] = m_levels[i][0];

	const CubeFaceFloatCoords	coords	= getCubeFaceCoords(Vec3(s, t, r));
	const int					size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float						u		= coords.s;
	float						v		= coords.t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, coords.s, size);
		v = unnormalize(sampler.wrapT, coords.t, size);
	}

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, coords.face, u, v, 0, sampleColors);

	const int	sampleIndices[4] = { 2, 3, 1, 0 }; // \note Gather returns the samples in a non-obvious order.
	Vec4		result;
	for (int i = 0; i < 4; i++)
		result[i] = sampleColors[sampleIndices[i]][componentNdx];

	return result;
}